

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O1

void libtorrent::apply_pack_impl
               (settings_pack *pack,session_settings_single_thread *sett,
               vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
               *callbacks)

{
  ushort uVar1;
  ushort uVar2;
  pointer ppVar3;
  size_t __n;
  size_t sVar4;
  pointer pcVar5;
  pointer ppVar6;
  pointer ppVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  __normal_iterator<void_(libtorrent::aux::session_impl::**)(),_std::vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>_>
  _Var12;
  size_t index;
  ulong uVar13;
  pair<unsigned_short,_int> *p;
  pointer ppVar14;
  pointer ppVar15;
  pointer ppVar16;
  string local_50;
  
  ppVar16 = (pack->m_strings).
            super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (pack->m_strings).
           super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar16 != ppVar3) {
    do {
      uVar1 = ppVar16->first;
      if (uVar1 < 0xd) {
        pbVar11 = aux::session_settings_single_thread::
                  get<std::__cxx11::string_const&,std::array<std::__cxx11::string,13ul>>
                            (sett,&sett->m_strings,(uint)uVar1,0);
        __n = pbVar11->_M_string_length;
        sVar4 = (ppVar16->second)._M_string_length;
        if ((__n != sVar4) ||
           ((__n != 0 &&
            (iVar9 = bcmp((pbVar11->_M_dataplus)._M_p,(ppVar16->second)._M_dataplus._M_p,__n),
            iVar9 != 0)))) {
          uVar2 = ppVar16->first;
          pcVar5 = (ppVar16->second)._M_dataplus._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar5,pcVar5 + sVar4);
          aux::session_settings_single_thread::set_str(sett,(uint)uVar2,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((callbacks !=
               (vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                *)0x0) && (*(long *)(&DAT_004fef70 + (ulong)uVar1 * 0x38) != 0)) {
            _Var12 = ::std::
                     __find_if<__gnu_cxx::__normal_iterator<void(libtorrent::aux::session_impl::**)(),std::vector<void(libtorrent::aux::session_impl::*)(),std::allocator<void(libtorrent::aux::session_impl::*)()>>>,__gnu_cxx::__ops::_Iter_equals_val<void(libtorrent::aux::session_impl::*const)()>>
                               ((callbacks->
                                super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                                )._M_impl.super__Vector_impl_data._M_start,
                                (callbacks->
                                super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                                )._M_impl.super__Vector_impl_data._M_finish,
                                &DAT_004fef70 + (ulong)uVar1 * 0x38);
            if (_Var12._M_current ==
                (callbacks->
                super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              ::std::
              vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
              ::push_back(callbacks,(value_type *)(&DAT_004fef70 + (ulong)uVar1 * 0x38));
            }
          }
        }
      }
      ppVar16 = ppVar16 + 1;
    } while (ppVar16 != ppVar3);
  }
  ppVar6 = (pack->m_ints).
           super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar14 = (pack->m_ints).
                 super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar14 != ppVar6; ppVar14 = ppVar14 + 1
      ) {
    if ((ppVar14->first & 0xc000) == 0x4000) {
      uVar10 = ppVar14->first & 0x3fff;
      if ((((uVar10 < 0x9f) && ((sett->m_ints)._M_elems[uVar10] != ppVar14->second)) &&
          ((sett->m_ints)._M_elems[uVar10] = ppVar14->second,
          callbacks !=
          (vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
           *)0x0)) && (*(long *)(&DAT_004f50b0 + (uVar10 << 5)) != 0)) {
        _Var12 = ::std::
                 __find_if<__gnu_cxx::__normal_iterator<void(libtorrent::aux::session_impl::**)(),std::vector<void(libtorrent::aux::session_impl::*)(),std::allocator<void(libtorrent::aux::session_impl::*)()>>>,__gnu_cxx::__ops::_Iter_equals_val<void(libtorrent::aux::session_impl::*const)()>>
                           ((callbacks->
                            super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                            (callbacks->
                            super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                            )._M_impl.super__Vector_impl_data._M_finish,
                            &DAT_004f50b0 + (uVar10 << 5));
        if (_Var12._M_current ==
            (callbacks->
            super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          ::std::
          vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
          ::push_back(callbacks,(value_type *)(&DAT_004f50b0 + (uVar10 << 5)));
        }
      }
    }
  }
  ppVar7 = (pack->m_bools).
           super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar15 = (pack->m_bools).
                 super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar7; ppVar15 = ppVar15 + 1
      ) {
    if ((ppVar15->first & 0xc000) == 0x8000) {
      uVar10 = ppVar15->first & 0x3fff;
      if ((uVar10 < 0x54) &&
         (ppVar15->second !=
          (((sett->m_bools).super__Base_bitset<2UL>._M_w[uVar10 >> 6] >> ((ulong)uVar10 & 0x3f) & 1)
          != 0))) {
        uVar8 = uVar10 >> 6;
        uVar13 = 1L << ((byte)uVar10 & 0x3f);
        if (ppVar15->second == false) {
          uVar13 = ~uVar13 & (sett->m_bools).super__Base_bitset<2UL>._M_w[uVar8];
        }
        else {
          uVar13 = uVar13 | (sett->m_bools).super__Base_bitset<2UL>._M_w[uVar8];
        }
        (sett->m_bools).super__Base_bitset<2UL>._M_w[uVar8] = uVar13;
        if ((callbacks !=
             (vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
              *)0x0) && (*(long *)(&DAT_004f6490 + (uVar10 << 5)) != 0)) {
          _Var12 = ::std::
                   __find_if<__gnu_cxx::__normal_iterator<void(libtorrent::aux::session_impl::**)(),std::vector<void(libtorrent::aux::session_impl::*)(),std::allocator<void(libtorrent::aux::session_impl::*)()>>>,__gnu_cxx::__ops::_Iter_equals_val<void(libtorrent::aux::session_impl::*const)()>>
                             ((callbacks->
                              super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                              )._M_impl.super__Vector_impl_data._M_start,
                              (callbacks->
                              super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                              )._M_impl.super__Vector_impl_data._M_finish,
                              &DAT_004f6490 + (uVar10 << 5));
          if (_Var12._M_current ==
              (callbacks->
              super__Vector_base<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            ::std::
            vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
            ::push_back(callbacks,(value_type *)(&DAT_004f6490 + (uVar10 << 5)));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void apply_pack_impl(settings_pack const* pack, aux::session_settings_single_thread& sett
		, std::vector<void(aux::session_impl::*)()>* callbacks)
	{
		for (auto const& p : pack->m_strings)
		{
			// disregard setting indices that are not string types
			if ((p.first & settings_pack::type_mask) != settings_pack::string_type_base)
				continue;

			// ignore settings that are out of bounds
			int const index = p.first & settings_pack::index_mask;
			TORRENT_ASSERT_PRECOND(index >= 0 && index < settings_pack::num_string_settings);
			if (index < 0 || index >= settings_pack::num_string_settings)
				continue;

			// if the value did not change, don't call the update callback
			if (sett.get_str(p.first) == p.second) continue;

			sett.set_str(p.first, p.second);
			str_setting_entry_t const& sa = str_settings[index];

			if (sa.fun && callbacks
				&& std::find(callbacks->begin(), callbacks->end(), sa.fun) == callbacks->end())
				callbacks->push_back(sa.fun);
		}

		for (auto const& p : pack->m_ints)
		{
			// disregard setting indices that are not int types
			if ((p.first & settings_pack::type_mask) != settings_pack::int_type_base)
				continue;

			// ignore settings that are out of bounds
			int const index = p.first & settings_pack::index_mask;
			TORRENT_ASSERT_PRECOND(index >= 0 && index < settings_pack::num_int_settings);
			if (index < 0 || index >= settings_pack::num_int_settings)
				continue;

			// if the value did not change, don't call the update callback
			if (sett.get_int(p.first) == p.second) continue;

			sett.set_int(p.first, p.second);
			int_setting_entry_t const& sa = int_settings[index];
			if (sa.fun && callbacks
				&& std::find(callbacks->begin(), callbacks->end(), sa.fun) == callbacks->end())
				callbacks->push_back(sa.fun);
		}

		for (auto const& p : pack->m_bools)
		{
			// disregard setting indices that are not bool types
			if ((p.first & settings_pack::type_mask) != settings_pack::bool_type_base)
				continue;

			// ignore settings that are out of bounds
			int const index = p.first & settings_pack::index_mask;
			TORRENT_ASSERT_PRECOND(index >= 0 && index < settings_pack::num_bool_settings);
			if (index < 0 || index >= settings_pack::num_bool_settings)
				continue;

			// if the value did not change, don't call the update callback
			if (sett.get_bool(p.first) == p.second) continue;

			sett.set_bool(p.first, p.second);
			bool_setting_entry_t const& sa = bool_settings[index];
			if (sa.fun && callbacks
				&& std::find(callbacks->begin(), callbacks->end(), sa.fun) == callbacks->end())
				callbacks->push_back(sa.fun);
		}
	}